

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_event.h
# Opt level: O3

void __thiscall
miniros::MessageEvent<const_void>::operator=
          (MessageEvent<const_void> *this,MessageEvent<const_void> *rhs)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  local_20 = (rhs->message_).super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_18 = (rhs->message_).super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
  if (local_18 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    goto LAB_00211a51;
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    local_18->_M_use_count = local_18->_M_use_count + 1;
    UNLOCK();
    if (__libc_single_threaded != '\0') goto LAB_00211a49;
    LOCK();
    local_18->_M_use_count = local_18->_M_use_count + 1;
    UNLOCK();
  }
  else {
    local_18->_M_use_count = local_18->_M_use_count + 1;
LAB_00211a49:
    local_18->_M_use_count = local_18->_M_use_count + 1;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
LAB_00211a51:
  init(this,(EVP_PKEY_CTX *)&local_20);
  this_00 = (this->message_copy_).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  (this->message_copy_).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->message_copy_).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  return;
}

Assistant:

void operator=(const MessageEvent<ConstMessage>& rhs)
  {
    ConstMessagePtr msg = std::static_pointer_cast<ConstMessage>(rhs.getMessage());
    init(msg,
      rhs.getConnectionHeaderPtr(),
      rhs.getReceiptTime(), rhs.nonConstWillCopy(), rhs.getMessageFactory());
    message_copy_.reset();
  }